

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string * __thiscall
ccs::ParserImpl::parseIdent_abi_cxx11_(string *__return_storage_ptr__,ParserImpl *this,char *what)

{
  pointer pSVar1;
  Location LVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  string asStack_1b8 [32];
  ostringstream _message;
  
  bVar3 = advanceIf(this,IDENT);
  if (bVar3) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(this->last_).value);
  }
  else {
    bVar3 = advanceIf(this,STRING);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&_message);
      anon_unknown_0::operator<<((ostream *)&_message,(this->cur_).type);
      poVar4 = std::operator<<((ostream *)&_message," cannot occur here. Expected ");
      std::operator<<(poVar4,what);
      psVar5 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LVar2 = (this->cur_).location;
      std::__cxx11::string::string(psVar5,asStack_1b8);
      *(Location *)(psVar5 + 0x20) = LVar2;
      __cxa_throw(psVar5,&(anonymous_namespace)::parse_error::typeinfo,
                  anon_unknown_0::parse_error::~parse_error);
    }
    pSVar1 = (this->last_).stringValue.elements_.
             super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((1 < (ulong)(((long)(this->last_).stringValue.elements_.
                            super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x28)) ||
       (pSVar1->isInterpolant == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&_message);
      poVar4 = std::operator<<((ostream *)&_message,"Interpolation not allowed in ");
      std::operator<<(poVar4,what);
      psVar5 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LVar2 = (this->last_).location;
      std::__cxx11::string::string(psVar5,asStack_1b8);
      *(Location *)(psVar5 + 0x20) = LVar2;
      __cxa_throw(psVar5,&(anonymous_namespace)::parse_error::typeinfo,
                  anon_unknown_0::parse_error::~parse_error);
    }
    StringVal::str_abi_cxx11_(__return_storage_ptr__,&(this->last_).stringValue);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parseIdent(const char *what) {
    if (advanceIf(Token::IDENT)) return last_.value;
    if (advanceIf(Token::STRING)) {
      if (last_.stringValue.interpolation())
        THROW(last_.location, "Interpolation not allowed in " << what);
      return last_.stringValue.str();
    }
    THROW(cur_.location, cur_.type << " cannot occur here. Expected " << what);
  }